

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

error_info *
toml::detail::make_type_error<toml::type_config>
          (error_info *__return_storage_ptr__,basic_value<toml::type_config> *v,string *fname,
          value_t ty)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t t;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  source_location local_a0;
  
  paVar1 = &local_298.field_2;
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar2,pcVar2 + fname->_M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_298,": bad_cast to ");
  std::__cxx11::ostringstream::ostringstream(local_218);
  toml::operator<<((ostream *)local_218,ty);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    uVar6 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_278._M_string_length + local_298._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar6 = local_278.field_2._M_allocated_capacity;
    }
    if (local_278._M_string_length + local_298._M_string_length <= (ulong)uVar6) {
      pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_278,0,0,local_298._M_dataplus._M_p,local_298._M_string_length);
      goto LAB_001d8ed7;
    }
  }
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_298,local_278._M_dataplus._M_p,local_278._M_string_length);
LAB_001d8ed7:
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar5) {
    local_2b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_2b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
  }
  local_2b8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  source_location::source_location(&local_a0,&v->region_);
  t = v->type_;
  std::__cxx11::ostringstream::ostringstream(local_218);
  toml::operator<<((ostream *)local_218,t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_238,0,0,"the actual type is ",0x13);
  local_258._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p == paVar5) {
    local_258.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_258.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_258._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  make_error_info<>(__return_storage_ptr__,&local_2b8,&local_a0,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_info make_type_error(const basic_value<TC>& v, const std::string& fname, const value_t ty)
{
    return make_error_info(fname + ": bad_cast to " + to_string(ty),
        v.location(), "the actual type is " + to_string(v.type()));
}